

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

_Bool sx_strequal(char *a,char *b)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = sx_strlen(a);
  uVar4 = sx_strlen(b);
  uVar5 = 0;
  if (uVar3 == uVar4) {
    uVar6 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar6 = 0;
    }
    do {
      if (uVar6 == uVar5) {
        uVar5 = (ulong)((long)(int)uVar3 <= (long)uVar5);
        goto LAB_001093d6;
      }
      pcVar1 = a + uVar5;
      pcVar2 = b + uVar5;
      uVar5 = uVar5 + 1;
    } while (*pcVar1 == *pcVar2);
    uVar5 = 0;
  }
LAB_001093d6:
  return SUB81(uVar5,0);
}

Assistant:

bool sx_strequal(const char* SX_RESTRICT a, const char* SX_RESTRICT b)
{
    int alen = sx_strlen(a);
    int blen = sx_strlen(b);
    if (alen != blen)
        return false;

    for (int i = 0; i < alen; i++) {
        if (a[i] != b[i])
            return false;
    }
    return true;
}